

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::CheckIfPrototypeChainContainsProxyObject(RecyclableObject *prototype)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  TypeId TVar4;
  undefined4 *puVar5;
  RecyclableObject *local_18;
  RecyclableObject *prototype_local;
  
  if (prototype != (RecyclableObject *)0x0) {
    BVar3 = IsObjectOrNull(prototype);
    local_18 = prototype;
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x2a30,"(JavascriptOperators::IsObjectOrNull(prototype))",
                                  "JavascriptOperators::IsObjectOrNull(prototype)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    while (TVar4 = RecyclableObject::GetTypeId(local_18), TVar4 != TypeIds_Null) {
      TVar4 = RecyclableObject::GetTypeId(local_18);
      if (TVar4 == TypeIds_Proxy) {
        return true;
      }
      local_18 = RecyclableObject::GetPrototype(local_18);
    }
  }
  return false;
}

Assistant:

bool JavascriptOperators::CheckIfPrototypeChainContainsProxyObject(RecyclableObject* prototype)
    {
        if (prototype == nullptr)
        {
            return false;
        }

        Assert(JavascriptOperators::IsObjectOrNull(prototype));

        while (prototype->GetTypeId() != TypeIds_Null)
        {
            if (prototype->GetTypeId() == TypeIds_Proxy)
            {
                return true;
            }

            prototype = prototype->GetPrototype();
        }

        return false;
    }